

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

bool lexer_CaptureMacroBody(CaptureBody *capture)

{
  bool bVar1;
  int c;
  int iVar2;
  LexerState *pLVar3;
  
  startCapture(capture);
  pLVar3 = lexerState;
  if (lexerState->isMmapped == true) {
    (lexerState->field_2).field_0.isReferenced = true;
  }
  if (pLVar3->atLineStart != true) {
    __assert_fail("lexerState->atLineStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,0x9f7,"lexer_CaptureMacroBody");
  }
  do {
    pLVar3->lineNo = pLVar3->lineNo + 1;
    pLVar3->colNo = 1;
    do {
      do {
        c = nextChar();
      } while (c == 9);
    } while (c == 0x20);
    bVar1 = startsIdentifier(c);
    if (bVar1) {
      iVar2 = readIdentifier((char)c);
      if (iVar2 == 0x6c) {
        lexerState->captureSize = lexerState->captureSize - 4;
        bVar1 = c != -1;
LAB_0010d2aa:
        endCapture(capture);
        lexerState->atLineStart = false;
        return bVar1;
      }
    }
    while ((c != 0xd && (c != 10))) {
      if (c == -1) {
        bVar1 = false;
        error("Unterminated macro definition\n");
        goto LAB_0010d2aa;
      }
      c = nextChar();
    }
    handleCRLF(c);
    pLVar3 = lexerState;
  } while( true );
}

Assistant:

bool lexer_CaptureMacroBody(struct CaptureBody *capture)
{
	startCapture(capture);

	// If the file is `mmap`ed, we need not to unmap it to keep access to the macro
	if (lexerState->isMmapped)
		lexerState->isReferenced = true;

	int c = EOF;

	// Due to parser internals, it reads the EOL after the expression before calling this.
	// Thus, we don't need to keep one in the buffer afterwards.
	// The following assertion checks that.
	assert(lexerState->atLineStart);
	for (;;) {
		nextLine();
		// We're at line start, so attempt to match an `ENDM` token
		do { // Discard initial whitespace
			c = nextChar();
		} while (isWhitespace(c));
		// Now, try to match `ENDM` as a **whole** identifier
		if (startsIdentifier(c)) {
			switch (readIdentifier(c)) {
			case T_POP_ENDM:
				// The ENDM has been captured, but we don't want it!
				// We know we have read exactly "ENDM", not e.g. an EQUS
				lexerState->captureSize -= strlen("ENDM");
				goto finish;
			}
		}

		// Just consume characters until EOL or EOF
		for (;; c = nextChar()) {
			if (c == EOF) {
				error("Unterminated macro definition\n");
				goto finish;
			} else if (c == '\n' || c == '\r') {
				handleCRLF(c);
				break;
			}
		}
	}

finish:
	endCapture(capture);
	// ENDM or EOF puts us past the start of the line
	lexerState->atLineStart = false;

	// Returns true if an ENDM terminated the block, false if it reached EOF first
	return c != EOF;
}